

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_helper.h
# Opt level: O0

date_time date::calendar_helper::from_seconds_count(seconds_count seconds)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  byte hour_00;
  minute_type minute_00;
  ushort uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  date_time dVar10;
  char cVar11;
  second_type second;
  minute_type minute;
  hour_type hour;
  seconds_count seconds_rest;
  year_type year;
  month_type month;
  day_type day;
  seconds_count m;
  seconds_count c;
  seconds_count y;
  seconds_count b;
  seconds_count a;
  seconds_count h;
  seconds_count z;
  seconds_count days_count;
  seconds_count seconds_local;
  
  lVar6 = seconds / 0x15180 + 0x132;
  uVar7 = lVar6 * 100 - 0x19;
  uVar8 = uVar7 / 0x37bb49;
  lVar9 = uVar8 - (uVar8 >> 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar9 * 100 + uVar7;
  uVar5 = SUB162(auVar1 / ZEXT816(0x8ead),0);
  lVar6 = (lVar9 + lVar6 + (ulong)uVar5 * -0x16d) - (ulong)(uVar5 >> 2);
  uVar7 = (lVar6 * 5 + 0x1c8U) / 0x99;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7 * 0x99 - 0x1c9;
  cVar11 = '\0';
  if (0xc < uVar7) {
    cVar11 = '\f';
  }
  auVar4._8_4_ = 0;
  auVar4._0_8_ = seconds % 0x15180;
  hour_00 = SUB121(auVar4 / ZEXT812(0xe10),0);
  uVar8 = seconds % 0x15180 - (long)(int)((uint)hour_00 * 0xe10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  minute_00 = SUB161(auVar3 / ZEXT816(0x3c),0);
  date_time::date_time
            ((date_time *)&seconds_local,uVar5 + (0xc < uVar7),(char)uVar7 - cVar11,
             (char)lVar6 - SUB161(auVar2 / ZEXT816(5),0),hour_00,minute_00,
             (char)uVar8 + minute_00 * -0x3c);
  dVar10.super_date.year = (undefined2)seconds_local;
  dVar10.super_date.month = seconds_local._2_1_;
  dVar10.super_date.day = seconds_local._3_1_;
  dVar10.super_time.hour = seconds_local._4_1_;
  dVar10.super_time.minute = seconds_local._5_1_;
  dVar10.super_time.second = seconds_local._6_1_;
  dVar10._7_1_ = seconds_local._7_1_;
  return dVar10;
}

Assistant:

static date_time from_seconds_count(seconds_count seconds)
    {
        const seconds_count days_count = seconds / (24 * 60 * 60);
        const seconds_count z = days_count + 306;
        const seconds_count h = 100 * z - 25;
        const seconds_count a = h / 3652425;
        const seconds_count b = a - a / 4;
        const seconds_count y = static_cast<year_type>((100 * b + h) / 36525);
        const seconds_count c = b + z - 365 * y - y / 4;
        const seconds_count m = (5 * c + 456) / 153;
        const auto day   = static_cast<day_type>(c - (153 * m - 457) / 5);
        const auto month = static_cast<month_type>(m - (m > 12 ? 12 : 0));
        const auto year  = static_cast<year_type>(y + (m > 12 ? 1 : 0));
        auto seconds_rest = seconds - days_count * (24 * 60 * 60);
        const auto hour = static_cast<hour_type>(seconds_rest / (60 * 60));
        seconds_rest -= hour * (60 * 60);
        const auto minute = static_cast<minute_type>(seconds_rest / 60);
        const auto second = static_cast<second_type>(seconds_rest - minute * 60);
        return date_time{ year, month, day, hour, minute, second };
    }